

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O3

void __thiscall duckdb::BaseStatistics::Merge(BaseStatistics *this,BaseStatistics *other)

{
  undefined1 uVar1;
  StatisticsType SVar2;
  bool bVar3;
  
  uVar1 = true;
  if (this->has_null == false) {
    uVar1 = other->has_null;
  }
  this->has_null = (bool)uVar1;
  bVar3 = other->has_no_null;
  if (this->has_no_null != false) {
    bVar3 = true;
  }
  this->has_no_null = bVar3;
  SVar2 = GetStatsType(&this->type);
  switch(SVar2) {
  case NUMERIC_STATS:
    NumericStats::Merge(this,other);
    return;
  case STRING_STATS:
    StringStats::Merge(this,other);
    return;
  case LIST_STATS:
    ListStats::Merge(this,other);
    return;
  case STRUCT_STATS:
    StructStats::Merge(this,other);
    return;
  default:
    return;
  case ARRAY_STATS:
    ArrayStats::Merge(this,other);
    return;
  }
}

Assistant:

void BaseStatistics::Merge(const BaseStatistics &other) {
	has_null = has_null || other.has_null;
	has_no_null = has_no_null || other.has_no_null;
	switch (GetStatsType()) {
	case StatisticsType::NUMERIC_STATS:
		NumericStats::Merge(*this, other);
		break;
	case StatisticsType::STRING_STATS:
		StringStats::Merge(*this, other);
		break;
	case StatisticsType::LIST_STATS:
		ListStats::Merge(*this, other);
		break;
	case StatisticsType::STRUCT_STATS:
		StructStats::Merge(*this, other);
		break;
	case StatisticsType::ARRAY_STATS:
		ArrayStats::Merge(*this, other);
		break;
	default:
		break;
	}
}